

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lj_lex_error(LexState *ls,LexToken token,ErrMsg em,...)

{
  uint uVar1;
  char in_AL;
  int in_ESI;
  long in_RDI;
  __va_list_tag *in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  char *in_XMM2_Qb;
  GCstr *in_XMM3_Qa;
  lua_State *in_XMM3_Qb;
  va_list argp;
  char *tok;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  LexState *in_stack_ffffffffffffff10;
  __va_list_tag *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  GCstr *in_stack_ffffffffffffff68;
  lua_State *in_stack_ffffffffffffff70;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff50 = in_XMM1_Qb;
    in_stack_ffffffffffffff58 = in_XMM2_Qa;
    in_stack_ffffffffffffff60 = in_XMM2_Qb;
    in_stack_ffffffffffffff68 = in_XMM3_Qa;
    in_stack_ffffffffffffff70 = in_XMM3_Qb;
  }
  if (in_ESI != 0) {
    if (((in_ESI == 0x11f) || (in_ESI == 0x120)) || (in_ESI == 0x11e)) {
      if (*(uint *)(in_RDI + 0x44) < *(int *)(in_RDI + 0x40) + 1U) {
        save_grow(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      }
      else {
        uVar1 = *(uint *)(in_RDI + 0x40);
        *(uint *)(in_RDI + 0x40) = uVar1 + 1;
        *(undefined1 *)(*(long *)(in_RDI + 0x38) + (ulong)uVar1) = 0;
      }
    }
    else {
      lj_lex_token2str((LexState *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
    }
  }
  lj_err_lex(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (BCLine)((ulong)in_stack_ffffffffffffff58 >> 0x20),(ErrMsg)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50);
}

Assistant:

void lj_lex_error(LexState *ls, LexToken token, ErrMsg em, ...)
{
  const char *tok;
  va_list argp;
  if (token == 0) {
    tok = NULL;
  } else if (token == TK_name || token == TK_string || token == TK_number) {
    save(ls, '\0');
    tok = ls->sb.buf;
  } else {
    tok = lj_lex_token2str(ls, token);
  }
  va_start(argp, em);
  lj_err_lex(ls->L, ls->chunkname, tok, ls->linenumber, em, argp);
  va_end(argp);
}